

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O1

void __thiscall
HighsSimplexAnalysis::setup
          (HighsSimplexAnalysis *this,string *lp_name,HighsLp *lp,HighsOptions *options,
          HighsInt simplex_iteration_count_)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  pointer pTVar4;
  pointer pdVar5;
  pointer pdVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  bool *pbVar11;
  bool *pbVar12;
  _func_void_HighsLogType_char_ptr_void_ptr *p_Var13;
  void *pvVar14;
  AnIterOpRec *pAVar15;
  HighsInt *pHVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  long lVar20;
  HighsValueDistribution *value_distribution;
  char *__end;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar2 = lp->num_row_;
  this->numRow = iVar2;
  iVar3 = lp->num_col_;
  this->numCol = iVar3;
  this->numTot = iVar3 + iVar2;
  std::__cxx11::string::_M_assign((string *)&this->model_name_);
  std::__cxx11::string::_M_assign((string *)&this->lp_name_);
  bVar1 = (byte)(options->super_HighsOptionsStruct).highs_analysis_level;
  this->analyse_lp_data = (bool)(bVar1 & 1);
  bVar17 = (bool)(bVar1 >> 1 & 1);
  this->analyse_simplex_summary_data = bVar17;
  bVar19 = (bool)(bVar1 >> 2 & 1);
  this->analyse_simplex_runtime_data = bVar19;
  this->analyse_factor_data = (bool)(bVar1 >> 4 & 1);
  bVar18 = true;
  if (bVar17 == false) {
    bVar18 = bVar19;
  }
  this->analyse_simplex_data = bVar18;
  *(undefined4 *)&this->highs_run_time = 0;
  *(undefined4 *)((long)&this->highs_run_time + 4) = 0;
  *(undefined4 *)&this->last_user_log_time = 0;
  *(undefined4 *)((long)&this->last_user_log_time + 4) = 0xfff00000;
  this->delta_user_log_time = 5.0;
  setupSimplexTime(this,options);
  setupFactorTime(this,options);
  this->AnIterIt0 = simplex_iteration_count_;
  pbVar11 = (options->super_HighsOptionsStruct).log_options.output_flag;
  pbVar12 = (options->super_HighsOptionsStruct).log_options.log_to_console;
  pHVar16 = (options->super_HighsOptionsStruct).log_options.log_dev_level;
  p_Var13 = (options->super_HighsOptionsStruct).log_options.user_log_callback;
  pvVar14 = (options->super_HighsOptionsStruct).log_options.user_log_callback_data;
  (this->log_options).log_stream = (options->super_HighsOptionsStruct).log_options.log_stream;
  (this->log_options).output_flag = pbVar11;
  (this->log_options).log_to_console = pbVar12;
  (this->log_options).log_dev_level = pHVar16;
  (this->log_options).user_log_callback = p_Var13;
  (this->log_options).user_log_callback_data = pvVar14;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::operator=(&(this->log_options).user_callback,
              &(options->super_HighsOptionsStruct).log_options.user_callback);
  (this->log_options).user_callback_data =
       (options->super_HighsOptionsStruct).log_options.user_callback_data;
  (this->log_options).user_callback_active =
       (options->super_HighsOptionsStruct).log_options.user_callback_active;
  this->timeless_log = (options->super_HighsOptionsStruct).timeless_log;
  this->col_aq_density = 0.0;
  this->row_ep_density = 0.0;
  this->row_ap_density = 0.0;
  this->row_DSE_density = 0.0;
  this->col_steepest_edge_density = 0.0;
  this->col_basic_feasibility_change_density = 0.0;
  this->row_basic_feasibility_change_density = 0.0;
  this->col_BFRT_density = 0.0;
  this->primal_col_density = 0.0;
  this->dual_col_density = 1.0;
  std::vector<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>::resize(&this->tran_stage,6);
  pTVar4 = (this->tran_stage).
           super__Vector_base<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_replace
            ((ulong)pTVar4,0,(char *)(pTVar4->name_)._M_string_length,0x3ddae0);
  pTVar4 = (this->tran_stage).
           super__Vector_base<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_replace
            ((ulong)(pTVar4 + 1),0,(char *)pTVar4[1].name_._M_string_length,0x3ddaec);
  pTVar4 = (this->tran_stage).
           super__Vector_base<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_replace
            ((ulong)(pTVar4 + 2),0,(char *)pTVar4[2].name_._M_string_length,0x3ddafb);
  pTVar4 = (this->tran_stage).
           super__Vector_base<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_replace
            ((ulong)(pTVar4 + 3),0,(char *)pTVar4[3].name_._M_string_length,0x3ddb07);
  pTVar4 = (this->tran_stage).
           super__Vector_base<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_replace
            ((ulong)(pTVar4 + 4),0,(char *)pTVar4[4].name_._M_string_length,0x3ddb13);
  pTVar4 = (this->tran_stage).
           super__Vector_base<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_replace
            ((ulong)(pTVar4 + 5),0,(char *)pTVar4[5].name_._M_string_length,0x3ddb22);
  lVar20 = -0x510;
  do {
    pTVar4 = (this->tran_stage).
             super__Vector_base<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>._M_impl.
             super__Vector_impl_data._M_start;
    initialiseScatterData
              (0x14,(HighsScatterData *)((long)&pTVar4[6].rhs_density_.max_num_point_ + lVar20));
    *(undefined8 *)((long)&pTVar4[6].num_decision_ + lVar20) = 0;
    *(undefined8 *)((long)&pTVar4[6].num_wrong_original_hyper_decision_ + lVar20) = 0;
    *(undefined4 *)((long)&pTVar4[6].num_wrong_new_hyper_decision_ + lVar20) = 0;
    lVar20 = lVar20 + 0xd8;
  } while (lVar20 != 0);
  std::vector<double,_std::allocator<double>_>::resize(&this->original_start_density_tolerance,6);
  std::vector<double,_std::allocator<double>_>::resize(&this->new_start_density_tolerance,6);
  std::vector<double,_std::allocator<double>_>::resize(&this->historical_density_tolerance,6);
  std::vector<double,_std::allocator<double>_>::resize(&this->predicted_density_tolerance,6);
  pdVar5 = (this->original_start_density_tolerance).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar6 = (this->new_start_density_tolerance).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar20 = 0;
  do {
    pdVar5[lVar20] = 0.05;
    pdVar6[lVar20] = 0.05;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 6);
  pdVar5 = (this->historical_density_tolerance).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  *pdVar5 = 0.15;
  pdVar5[2] = 0.1;
  pdVar5[3] = 0.1;
  pdVar5[5] = 0.15;
  pdVar5 = (this->predicted_density_tolerance).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  *pdVar5 = 0.1;
  pdVar5[2] = 0.1;
  pdVar5[3] = 0.1;
  pdVar5[5] = 0.1;
  iVar2 = (options->super_HighsOptionsStruct).simplex_dual_edge_weight_strategy;
  if ((iVar2 == -1) || (iVar2 == 2)) {
    this->max_average_log_high_dual_steepest_edge_weight_error = 0.0;
    this->max_sum_average_log_extreme_dual_steepest_edge_weight_error = 0.0;
    this->max_sum_average_frequency_extreme_dual_steepest_edge_weight = 0.0;
    this->max_average_log_low_dual_steepest_edge_weight_error = 0.0;
    this->max_average_frequency_low_dual_steepest_edge_weight = 0.0;
    this->max_average_frequency_high_dual_steepest_edge_weight = 0.0;
    this->average_log_low_dual_steepest_edge_weight_error = 0.0;
    this->average_log_high_dual_steepest_edge_weight_error = 0.0;
    this->average_frequency_low_dual_steepest_edge_weight = 0.0;
    this->average_frequency_high_dual_steepest_edge_weight = 0.0;
    this->num_dual_steepest_edge_weight_check = 0;
    this->num_dual_steepest_edge_weight_reject = 0;
    this->num_wrong_low_dual_steepest_edge_weight = 0;
    this->num_wrong_high_dual_steepest_edge_weight = 0;
  }
  this->num_devex_framework = 0;
  this->num_invert_report_since_last_header = -1;
  this->num_iteration_report_since_last_header = -1;
  this->entering_variable = -1;
  this->pivotal_row_index = -1;
  this->average_concurrency = -1.0;
  this->average_fraction_of_possible_minor_iterations_performed = -1.0;
  this->sum_multi_chosen = 0;
  this->sum_multi_finished = 0;
  if (this->analyse_simplex_summary_data == true) {
    this->AnIterPrevIt = simplex_iteration_count_;
    lVar20 = 0;
    std::__cxx11::string::_M_replace
              ((ulong)&this->AnIterOp[0].AnIterOpName,0,
               (char *)this->AnIterOp[0].AnIterOpName._M_string_length,0x3ddb2e);
    std::__cxx11::string::_M_replace
              ((ulong)&this->AnIterOp[1].AnIterOpName,0,
               (char *)this->AnIterOp[1].AnIterOpName._M_string_length,0x3ddb39);
    std::__cxx11::string::_M_replace
              ((ulong)&this->AnIterOp[2].AnIterOpName,0,
               (char *)this->AnIterOp[2].AnIterOpName._M_string_length,0x3ddb44);
    std::__cxx11::string::_M_replace
              ((ulong)&this->AnIterOp[3].AnIterOpName,0,
               (char *)this->AnIterOp[3].AnIterOpName._M_string_length,0x3ddb51);
    std::__cxx11::string::_M_replace
              ((ulong)&this->AnIterOp[4].AnIterOpName,0,
               (char *)this->AnIterOp[4].AnIterOpName._M_string_length,0x3ddb5e);
    std::__cxx11::string::_M_replace
              ((ulong)&this->AnIterOp[5].AnIterOpName,0,
               (char *)this->AnIterOp[5].AnIterOpName._M_string_length,0x3ddb68);
    std::__cxx11::string::_M_replace
              ((ulong)&this->AnIterOp[6].AnIterOpName,0,
               (char *)this->AnIterOp[6].AnIterOpName._M_string_length,0x3ddb72);
    std::__cxx11::string::_M_replace
              ((ulong)&this->AnIterOp[7].AnIterOpName,0,
               (char *)this->AnIterOp[7].AnIterOpName._M_string_length,0x3ddb78);
    std::__cxx11::string::_M_replace
              ((ulong)&this->AnIterOp[8].AnIterOpName,0,
               (char *)this->AnIterOp[8].AnIterOpName._M_string_length,0x3ddb83);
    std::__cxx11::string::_M_replace
              ((ulong)&this->AnIterOp[9].AnIterOpName,0,
               (char *)this->AnIterOp[9].AnIterOpName._M_string_length,0x3ddb8d);
    pAVar15 = this->AnIterOp;
    do {
      value_distribution = &pAVar15->AnIterOp_density;
      uVar7 = 0;
      uVar8 = 0x3ff00000;
      uVar9 = 0;
      uVar10 = 0x3ff00000;
      pHVar16 = &this->numCol;
      if (((uint)lVar20 & 0xb) != 1 && lVar20 != 3) {
        uVar7 = 0x9999999a;
        uVar8 = 0x3fa99999;
        uVar9 = 0x33333333;
        uVar10 = 0x3fc33333;
        pHVar16 = &this->numRow;
      }
      *(undefined4 *)((long)(value_distribution + -1) + 0x48) = uVar7;
      *(undefined4 *)((long)(value_distribution + -1) + 0x4c) = uVar8;
      *(undefined4 *)((long)(value_distribution + -1) + 0x50) = uVar9;
      *(undefined4 *)((long)(value_distribution + -1) + 0x54) = uVar10;
      *(HighsInt *)((long)(value_distribution + -1) + 0x58) = *pHVar16;
      *(undefined8 *)((long)(value_distribution + -1) + 0x5c) = 0;
      *(undefined8 *)((long)(value_distribution + -1) + 100) = 0;
      *(undefined4 *)((long)(value_distribution + -1) + 0x6c) = 0;
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"","");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"density ","");
      initialiseValueDistribution(&local_470,&local_50,1e-08,1.0,10.0,value_distribution);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p);
      }
      lVar20 = lVar20 + 1;
      pAVar15 = (AnIterOpRec *)(value_distribution + 1);
    } while (lVar20 != 10);
    this->AnIterNumInvert[8] = 0;
    this->AnIterNumInvert[9] = 0;
    this->AnIterNumInvert[10] = 0;
    this->AnIterNumInvert[0xb] = 0;
    this->AnIterNumInvert[5] = 0;
    this->AnIterNumInvert[6] = 0;
    this->AnIterNumInvert[7] = 0;
    this->AnIterNumInvert[8] = 0;
    this->AnIterNumInvert[1] = 0;
    this->AnIterNumInvert[2] = 0;
    this->AnIterNumInvert[3] = 0;
    this->AnIterNumInvert[4] = 0;
    this->num_col_price = 0;
    this->num_row_price = 0;
    this->num_row_price_with_switch = 0;
    this->num_primal_cycling_detections = 0;
    this->num_dual_cycling_detections = 0;
    this->num_quad_chuzc = 0;
    this->num_heap_chuzc = 0;
    this->sum_quad_chuzc_size = 0.0;
    this->sum_heap_chuzc_size = 0.0;
    this->max_quad_chuzc_size = 0;
    this->max_heap_chuzc_size = 0;
    this->num_improve_choose_column_row_call = 0;
    this->num_remove_pivot_from_pack = 0;
    this->num_correct_dual_primal_flip = 0;
    this->min_correct_dual_primal_flip_dual_infeasibility = INFINITY;
    this->max_correct_dual_primal_flip = 0.0;
    this->num_correct_dual_cost_shift = 0;
    this->AnIterNumEdWtIt[2] = 0;
    this->AnIterNumEdWtIt[0] = 0;
    this->AnIterNumEdWtIt[1] = 0;
    this->max_correct_dual_cost_shift_dual_infeasibility = 0.0;
    this->max_correct_dual_cost_shift = 0.0;
    this->net_num_single_cost_shift = 0;
    this->num_single_cost_shift = 0;
    this->max_single_cost_shift = 0.0;
    this->sum_single_cost_shift = 0.0;
    this->AnIterTraceNumRec = 0;
    this->AnIterTraceIterDl = 1;
    this->AnIterTrace[0].AnIterTraceIter = this->AnIterIt0;
    lVar20 = std::chrono::_V2::system_clock::now();
    this->AnIterTrace[0].AnIterTraceTime = (double)lVar20 / 1000000000.0;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Primal step summary","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
    initialiseValueDistribution
              (&local_70,&local_90,1e-16,1e+16,10.0,&this->primal_step_distribution);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Dual step summary","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
    initialiseValueDistribution(&local_b0,&local_d0,1e-16,1e+16,10.0,&this->dual_step_distribution);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Simplex pivot summary","");
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
    initialiseValueDistribution
              (&local_f0,&local_110,1e-08,1e+16,10.0,&this->simplex_pivot_distribution);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"Factor pivot threshold summary","");
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
    initialiseValueDistribution
              (&local_130,&local_150,0.0008,0.5,5.0,&this->factor_pivot_threshold_distribution);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"Numerical trouble summary","");
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"");
    initialiseValueDistribution
              (&local_170,&local_190,1e-16,1.0,10.0,&this->numerical_trouble_distribution);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,"Edge weight error summary","");
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
    initialiseValueDistribution
              (&local_1b0,&local_1d0,1e-16,1.0,10.0,&this->edge_weight_error_distribution);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"1 ","");
    initialiseValueDistribution
              (&local_1f0,&local_210,1e-16,1e+16,10.0,&this->cost_perturbation1_distribution);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"2 ","");
    initialiseValueDistribution
              (&local_230,&local_250,1e-16,1e+16,10.0,&this->cost_perturbation2_distribution);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_270,"FTRAN upper sparse summary - before","");
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"");
    initialiseValueDistribution
              (&local_270,&local_290,1e-08,1.0,10.0,&this->before_ftran_upper_sparse_density);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,"FTRAN upper sparse summary - after","");
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
    initialiseValueDistribution
              (&local_2b0,&local_2d0,1e-08,1.0,10.0,&this->before_ftran_upper_hyper_density);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2f0,"FTRAN upper hyper-sparse summary - before","");
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"");
    initialiseValueDistribution
              (&local_2f0,&local_310,1e-08,1.0,10.0,&this->ftran_upper_sparse_density);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_330,"FTRAN upper hyper-sparse summary - after","");
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"");
    initialiseValueDistribution
              (&local_330,&local_350,1e-08,1.0,10.0,&this->ftran_upper_hyper_density);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p);
    }
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_370,"Cleanup dual change summary","");
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"");
    initialiseValueDistribution
              (&local_370,&local_390,1e-16,1e+16,10.0,&this->cleanup_dual_change_distribution);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p);
    }
    local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3b0,"Cleanup primal change summary","");
    local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"");
    initialiseValueDistribution
              (&local_3b0,&local_3d0,1e-16,1e+16,10.0,&this->cleanup_primal_step_distribution);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      operator_delete(local_3d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p);
    }
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3f0,"Cleanup primal step summary","");
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"");
    initialiseValueDistribution
              (&local_3f0,&local_410,1e-16,1e+16,10.0,&this->cleanup_primal_change_distribution);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p);
    }
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_430,"Cleanup dual step summary","");
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
    initialiseValueDistribution
              (&local_430,&local_450,1e-16,1e+16,10.0,&this->cleanup_dual_step_distribution);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::setup(const std::string lp_name, const HighsLp& lp,
                                 const HighsOptions& options,
                                 const HighsInt simplex_iteration_count_) {
  // Copy Problem size
  numRow = lp.num_row_;
  numCol = lp.num_col_;
  numTot = numRow + numCol;
  model_name_ = lp.model_name_;
  lp_name_ = lp_name;
  // Set up analysis logic short-cuts
  analyse_lp_data = kHighsAnalysisLevelModelData & options.highs_analysis_level;
  analyse_simplex_summary_data =
      kHighsAnalysisLevelSolverSummaryData & options.highs_analysis_level;
  analyse_simplex_runtime_data =
      kHighsAnalysisLevelSolverRuntimeData & options.highs_analysis_level;
  analyse_factor_data =
      kHighsAnalysisLevelNlaData & options.highs_analysis_level;
  analyse_simplex_data =
      analyse_simplex_summary_data || analyse_simplex_runtime_data;
  highs_run_time = 0;
  last_user_log_time = -kHighsInf;
  delta_user_log_time = 5e0;

  setupSimplexTime(options);
  setupFactorTime(options);

  // Copy tolerances from options
  //  allow_dual_steepest_edge_to_devex_switch =
  //      options.simplex_dual_edge_weight_strategy ==
  //      kSimplexEdgeWeightStrategyChoose;
  //  dual_steepest_edge_weight_log_error_threshold =
  //      options.dual_steepest_edge_weight_log_error_threshold;
  //
  AnIterIt0 = simplex_iteration_count_;
  //  AnIterCostlyDseFq = 0;
  //  AnIterNumCostlyDseIt = 0;
  // Copy messaging parameter from options
  messaging(options.log_options);
  timeless_log = options.timeless_log;
  // Initialise the densities
  col_aq_density = 0;
  row_ep_density = 0;
  row_ap_density = 0;
  row_DSE_density = 0;
  col_steepest_edge_density = 0;
  col_basic_feasibility_change_density = 0;
  row_basic_feasibility_change_density = 0;
  col_BFRT_density = 0;
  primal_col_density = 0;
  // Set the row_dual_density to 1 since it's assumed all costs are at
  // least perturbed from zero, if not initially nonzero
  dual_col_density = 1;
  // Set up the data structures for scatter data
  tran_stage.resize(NUM_TRAN_STAGE_TYPE);
  tran_stage[TRAN_STAGE_FTRAN_LOWER].name_ = "FTRAN lower";
  tran_stage[TRAN_STAGE_FTRAN_UPPER_FT].name_ = "FTRAN upper FT";
  tran_stage[TRAN_STAGE_FTRAN_UPPER].name_ = "FTRAN upper";
  tran_stage[TRAN_STAGE_BTRAN_UPPER].name_ = "BTRAN upper";
  tran_stage[TRAN_STAGE_BTRAN_UPPER_FT].name_ = "BTRAN upper FT";
  tran_stage[TRAN_STAGE_BTRAN_LOWER].name_ = "BTRAN lower";
  for (HighsInt tran_stage_type = 0; tran_stage_type < NUM_TRAN_STAGE_TYPE;
       tran_stage_type++) {
    TranStageAnalysis& stage = tran_stage[tran_stage_type];
    initialiseScatterData(20, stage.rhs_density_);
    stage.num_decision_ = 0;
    stage.num_wrong_original_sparse_decision_ = 0;
    stage.num_wrong_original_hyper_decision_ = 0;
    stage.num_wrong_new_sparse_decision_ = 0;
    stage.num_wrong_new_hyper_decision_ = 0;
  }
  original_start_density_tolerance.resize(NUM_TRAN_STAGE_TYPE);
  new_start_density_tolerance.resize(NUM_TRAN_STAGE_TYPE);
  historical_density_tolerance.resize(NUM_TRAN_STAGE_TYPE);
  predicted_density_tolerance.resize(NUM_TRAN_STAGE_TYPE);

  for (HighsInt tran_stage_type = 0; tran_stage_type < NUM_TRAN_STAGE_TYPE;
       tran_stage_type++) {
    original_start_density_tolerance[tran_stage_type] = 0.05;
    new_start_density_tolerance[tran_stage_type] = 0.05;
  }
  historical_density_tolerance[TRAN_STAGE_FTRAN_LOWER] = 0.15;
  historical_density_tolerance[TRAN_STAGE_FTRAN_UPPER] = 0.10;
  historical_density_tolerance[TRAN_STAGE_BTRAN_UPPER] = 0.10;
  historical_density_tolerance[TRAN_STAGE_BTRAN_LOWER] = 0.15;
  predicted_density_tolerance[TRAN_STAGE_FTRAN_LOWER] = 0.10;
  predicted_density_tolerance[TRAN_STAGE_FTRAN_UPPER] = 0.10;
  predicted_density_tolerance[TRAN_STAGE_BTRAN_UPPER] = 0.10;
  predicted_density_tolerance[TRAN_STAGE_BTRAN_LOWER] = 0.10;

  // Initialise the measures used to analyse accuracy of steepest edge weights
  //
  const HighsInt dual_edge_weight_strategy =
      options.simplex_dual_edge_weight_strategy;
  if (dual_edge_weight_strategy == kSimplexEdgeWeightStrategyChoose ||
      dual_edge_weight_strategy == kSimplexEdgeWeightStrategySteepestEdge) {
    // Initialise the measures used to analyse accuracy of steepest edge weights
    num_dual_steepest_edge_weight_check = 0;
    num_dual_steepest_edge_weight_reject = 0;
    num_wrong_low_dual_steepest_edge_weight = 0;
    num_wrong_high_dual_steepest_edge_weight = 0;
    average_frequency_low_dual_steepest_edge_weight = 0;
    average_frequency_high_dual_steepest_edge_weight = 0;
    average_log_low_dual_steepest_edge_weight_error = 0;
    average_log_high_dual_steepest_edge_weight_error = 0;
    max_average_frequency_low_dual_steepest_edge_weight = 0;
    max_average_frequency_high_dual_steepest_edge_weight = 0;
    max_sum_average_frequency_extreme_dual_steepest_edge_weight = 0;
    max_average_log_low_dual_steepest_edge_weight_error = 0;
    max_average_log_high_dual_steepest_edge_weight_error = 0;
    max_sum_average_log_extreme_dual_steepest_edge_weight_error = 0;
  }
  num_devex_framework = 0;

  num_iteration_report_since_last_header = -1;
  num_invert_report_since_last_header = -1;
  // Set values used to skip an iteration report when column (row)
  // choice has found nothing in primal (dual) simplex
  entering_variable = -1;
  pivotal_row_index = -1;

  // Set following averages to illegal values so that first average is
  // set equal to first value
  average_concurrency = -1;
  average_fraction_of_possible_minor_iterations_performed = -1;
  sum_multi_chosen = 0;
  sum_multi_finished = 0;

  if (analyse_simplex_summary_data) {
    AnIterPrevIt = simplex_iteration_count_;

    AnIterOpRec* AnIter;
    AnIter = &AnIterOp[kSimplexNlaBtranFull];
    AnIter->AnIterOpName = "BTRAN Full";
    AnIter = &AnIterOp[kSimplexNlaPriceFull];
    AnIter->AnIterOpName = "PRICE Full";
    AnIter = &AnIterOp[kSimplexNlaBtranBasicFeasibilityChange];
    AnIter->AnIterOpName = "BTRAN BcFsCg";
    AnIter = &AnIterOp[kSimplexNlaPriceBasicFeasibilityChange];
    AnIter->AnIterOpName = "PRICE BcFsCg";
    AnIter = &AnIterOp[kSimplexNlaBtranEp];
    AnIter->AnIterOpName = "BTRAN e_p";
    AnIter = &AnIterOp[kSimplexNlaPriceAp];
    AnIter->AnIterOpName = "PRICE a_p";
    AnIter = &AnIterOp[kSimplexNlaFtran];
    AnIter->AnIterOpName = "FTRAN";
    AnIter = &AnIterOp[kSimplexNlaFtranBfrt];
    AnIter->AnIterOpName = "FTRAN BFRT";
    AnIter = &AnIterOp[kSimplexNlaFtranDse];
    AnIter->AnIterOpName = "FTRAN DSE";
    AnIter = &AnIterOp[kSimplexNlaBtranPse];
    AnIter->AnIterOpName = "BTRAN PSE";
    for (HighsInt k = 0; k < kNumSimplexNlaOperation; k++) {
      AnIter = &AnIterOp[k];
      if ((k == kSimplexNlaPriceAp) ||
          (k == kSimplexNlaPriceBasicFeasibilityChange) ||
          (k == kSimplexNlaPriceFull)) {
        AnIter->AnIterOpHyperCANCEL = 1.0;
        AnIter->AnIterOpHyperTRAN = 1.0;
        AnIter->AnIterOpRsDim = numCol;
      } else {
        if ((k == kSimplexNlaBtranEp) ||
            (k == kSimplexNlaBtranBasicFeasibilityChange) ||
            (k == kSimplexNlaBtranFull)) {
          AnIter->AnIterOpHyperCANCEL = kHyperCancel;
          AnIter->AnIterOpHyperTRAN = kHyperBtranU;
        } else {
          AnIter->AnIterOpHyperCANCEL = kHyperCancel;
          AnIter->AnIterOpHyperTRAN = kHyperFtranL;
        }
        AnIter->AnIterOpRsDim = numRow;
      }
      AnIter->AnIterOpNumCa = 0;
      AnIter->AnIterOpNumHyperOp = 0;
      AnIter->AnIterOpNumHyperRs = 0;
      AnIter->AnIterOpSumLog10RsDensity = 0;
      initialiseValueDistribution("", "density ", 1e-8, 1.0, 10.0,
                                  AnIter->AnIterOp_density);
    }
    HighsInt last_rebuild_reason = kRebuildReasonCount - 1;
    for (HighsInt k = 1; k <= last_rebuild_reason; k++) AnIterNumInvert[k] = 0;
    num_col_price = 0;
    num_row_price = 0;
    num_row_price_with_switch = 0;
    num_primal_cycling_detections = 0;
    num_dual_cycling_detections = 0;
    // Initialise the dual simplex flip/shift records
    num_quad_chuzc = 0;
    num_heap_chuzc = 0;
    sum_quad_chuzc_size = 0;
    sum_heap_chuzc_size = 0;
    max_quad_chuzc_size = 0;
    max_heap_chuzc_size = 0;

    num_improve_choose_column_row_call = 0;
    num_remove_pivot_from_pack = 0;

    num_correct_dual_primal_flip = 0;
    min_correct_dual_primal_flip_dual_infeasibility = kHighsInf;
    max_correct_dual_primal_flip = 0;
    num_correct_dual_cost_shift = 0;
    max_correct_dual_cost_shift_dual_infeasibility = 0;
    max_correct_dual_cost_shift = 0;
    net_num_single_cost_shift = 0;
    num_single_cost_shift = 0;
    max_single_cost_shift = 0;
    sum_single_cost_shift = 0;
    HighsInt last_edge_weight_mode = (HighsInt)EdgeWeightMode::kSteepestEdge;
    for (HighsInt k = 0; k <= last_edge_weight_mode; k++)
      AnIterNumEdWtIt[k] = 0;
    AnIterTraceNumRec = 0;
    AnIterTraceIterDl = 1;
    AnIterTraceRec* lcAnIter = &AnIterTrace[0];
    lcAnIter->AnIterTraceIter = AnIterIt0;
    lcAnIter->AnIterTraceTime = timer_->getWallTime();
    initialiseValueDistribution("Primal step summary", "", 1e-16, 1e16, 10.0,
                                primal_step_distribution);
    initialiseValueDistribution("Dual step summary", "", 1e-16, 1e16, 10.0,
                                dual_step_distribution);
    initialiseValueDistribution("Simplex pivot summary", "", 1e-8, 1e16, 10.0,
                                simplex_pivot_distribution);
    initialiseValueDistribution("Factor pivot threshold summary", "",
                                kMinPivotThreshold, kMaxPivotThreshold,
                                kPivotThresholdChangeFactor,
                                factor_pivot_threshold_distribution);
    initialiseValueDistribution("Numerical trouble summary", "", 1e-16, 1.0,
                                10.0, numerical_trouble_distribution);
    initialiseValueDistribution("Edge weight error summary", "", 1e-16, 1.0,
                                10.0, edge_weight_error_distribution);
    initialiseValueDistribution("", "1 ", 1e-16, 1e16, 10.0,
                                cost_perturbation1_distribution);
    initialiseValueDistribution("", "2 ", 1e-16, 1e16, 10.0,
                                cost_perturbation2_distribution);
    initialiseValueDistribution("FTRAN upper sparse summary - before", "", 1e-8,
                                1.0, 10.0, before_ftran_upper_sparse_density);
    initialiseValueDistribution("FTRAN upper sparse summary - after", "", 1e-8,
                                1.0, 10.0, before_ftran_upper_hyper_density);
    initialiseValueDistribution("FTRAN upper hyper-sparse summary - before", "",
                                1e-8, 1.0, 10.0, ftran_upper_sparse_density);
    initialiseValueDistribution("FTRAN upper hyper-sparse summary - after", "",
                                1e-8, 1.0, 10.0, ftran_upper_hyper_density);
    initialiseValueDistribution("Cleanup dual change summary", "", 1e-16, 1e16,
                                10.0, cleanup_dual_change_distribution);
    initialiseValueDistribution("Cleanup primal change summary", "", 1e-16,
                                1e16, 10.0, cleanup_primal_step_distribution);
    initialiseValueDistribution("Cleanup primal step summary", "", 1e-16, 1e16,
                                10.0, cleanup_primal_change_distribution);
    initialiseValueDistribution("Cleanup dual step summary", "", 1e-16, 1e16,
                                10.0, cleanup_dual_step_distribution);
  }
}